

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O0

void free_cache(VMEMcache *cache)

{
  int iVar1;
  stat_t local_30;
  stat_t pool_ued;
  stat_t dram;
  stat_t heap_entries;
  stat_t entries;
  VMEMcache *cache_local;
  
  entries = (stat_t)cache;
  do {
    iVar1 = vmemcache_evict(entries,0);
  } while (iVar1 == 0);
  get_stat((VMEMcache *)entries,&heap_entries,VMEMCACHE_STAT_ENTRIES);
  get_stat((VMEMcache *)entries,&dram,VMEMCACHE_STAT_HEAP_ENTRIES);
  get_stat((VMEMcache *)entries,&pool_ued,VMEMCACHE_STAT_DRAM_SIZE_USED);
  get_stat((VMEMcache *)entries,&local_30,VMEMCACHE_STAT_POOL_SIZE_USED);
  if (heap_entries != 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
            ,0x49,"free_cache");
    fprintf(_stderr,"%llu entries were not freed",heap_entries);
    fprintf(_stderr,"\n");
    abort();
  }
  if (pool_ued != 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
            ,0x4b,"free_cache");
    fprintf(_stderr,"%llu bytes of DRAM memory were not freed",pool_ued);
    fprintf(_stderr,"\n");
    abort();
  }
  if (local_30 == 0) {
    if (dram == 1) {
      return;
    }
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
            ,0x4f,"free_cache");
    fprintf(_stderr,"%llu heap entries were not merged",dram - 1);
    fprintf(_stderr,"\n");
    abort();
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
          ,0x4d,"free_cache");
  fprintf(_stderr,"%llu bytes of pool memory were not freed",local_30);
  fprintf(_stderr,"\n");
  abort();
}

Assistant:

static void
free_cache(VMEMcache *cache)
{
	/* evict all entries from the cache */
	while (vmemcache_evict(cache, NULL, 0) == 0)
		;

#ifdef STATS_ENABLED
	/* verify that all memory is freed */
	stat_t entries, heap_entries, dram, pool_ued;
	get_stat(cache, &entries, VMEMCACHE_STAT_ENTRIES);
	get_stat(cache, &heap_entries, VMEMCACHE_STAT_HEAP_ENTRIES);
	get_stat(cache, &dram, VMEMCACHE_STAT_DRAM_SIZE_USED);
	get_stat(cache, &pool_ued, VMEMCACHE_STAT_POOL_SIZE_USED);

	if (entries != 0)
		UT_FATAL("%llu entries were not freed", entries);
	if (dram != 0)
		UT_FATAL("%llu bytes of DRAM memory were not freed", dram);
	if (pool_ued != 0)
		UT_FATAL("%llu bytes of pool memory were not freed", pool_ued);
	if (heap_entries != 1)
		UT_FATAL("%llu heap entries were not merged", heap_entries - 1);
#endif /* STATS_ENABLED */
}